

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void delay_timer_cb(uv_timer_t *timer)

{
  uv_poll_t *handle;
  int iVar1;
  undefined8 uVar2;
  uint pevents;
  char *pcVar3;
  
  handle = (uv_poll_t *)timer->data;
  iVar1 = uv_is_active((uv_handle_t *)timer);
  if (iVar1 == 0) {
    if (*(uint *)(handle[2].handle_queue + 1) == 0) {
      pcVar3 = "context->delayed_events != 0";
      uVar2 = 0x1b1;
    }
    else {
      pevents = *(uint *)(handle[2].handle_queue + 1) | *(uint *)((long)handle[2].handle_queue + 4);
      *(uint *)((long)handle[2].handle_queue + 4) = pevents;
      *(undefined4 *)(handle[2].handle_queue + 1) = 0;
      iVar1 = uv_poll_start(handle,pevents,connection_poll_cb);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "r == 0";
      uVar2 = 0x1b8;
    }
  }
  else {
    pcVar3 = "0 == uv_is_active((uv_handle_t*) timer)";
    uVar2 = 0x1ae;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void delay_timer_cb(uv_timer_t* timer) {
  connection_context_t* context = (connection_context_t*) timer->data;
  int r;

  /* Timer should auto stop. */
  ASSERT(0 == uv_is_active((uv_handle_t*) timer));

  /* Add the requested events to the poll mask. */
  ASSERT(context->delayed_events != 0);
  context->events |= context->delayed_events;
  context->delayed_events = 0;

  r = uv_poll_start(&context->poll_handle,
                    context->events,
                    connection_poll_cb);
  ASSERT(r == 0);
}